

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.cpp
# Opt level: O1

void __thiscall
Nova::Simplex_Mesh<3>::Find_And_Append_Adjacent_Elements
          (Simplex_Mesh<3> *this,int simplex,Vector<int,_2,_true> *face)

{
  long lVar1;
  bool bVar2;
  pointer pAVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  Vector<int,_1,_true> other_nodes;
  int simplex2;
  T_STORAGE local_48;
  int local_44;
  ulong local_40;
  long local_38;
  
  uVar6 = (ulong)(face->_data)._M_elems[0];
  local_48._M_elems[0] = (_Type)(face->_data)._M_elems[1];
  pAVar3 = (this->incident_elements->_data).
           super__Vector_base<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->incident_elements->_data).
                 super__Vector_base<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pAVar3 >> 3) * -0x5555555555555555;
  uVar7 = uVar6;
  if (uVar6 <= uVar4 && uVar4 - uVar6 != 0) {
    local_40 = (ulong)simplex;
    uVar4 = 0xffffffffffffffff;
    lVar8 = 0;
    local_38 = local_40 * 3;
    do {
      lVar1 = *(long *)&pAVar3[uVar6]._data.super__Vector_base<int,_std::allocator<int>_>;
      uVar5 = (long)*(pointer *)
                     ((long)&pAVar3[uVar6]._data.super__Vector_base<int,_std::allocator<int>_> + 8)
              - lVar1 >> 2;
      uVar4 = uVar4 + 1;
      if (uVar5 <= uVar4) {
        return;
      }
      uVar7 = lVar8 >> 0x20;
      if (uVar5 <= uVar7) break;
      local_44 = *(int *)(lVar1 + uVar7 * 4);
      if ((local_44 != simplex) &&
         (bVar2 = Nodes_In_Simplex<1>(this,(Vector<int,_1,_true> *)&local_48,local_44), bVar2)) {
        pAVar3 = (this->adjacent_elements->_data).
                 super__Vector_base<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = ((long)(this->adjacent_elements->_data).
                       super__Vector_base<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pAVar3 >> 3) *
                -0x5555555555555555;
        uVar7 = local_40;
        if (uVar5 < local_40 || uVar5 - local_40 == 0) break;
        Array<int>::Append_Unique
                  ((Array<int> *)
                   ((long)&(pAVar3->_data).super__Vector_base<int,_std::allocator<int>_> +
                   local_38 * 8),&local_44);
      }
      lVar8 = lVar8 + 0x100000000;
      pAVar3 = (this->incident_elements->_data).
               super__Vector_base<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->incident_elements->_data).
                     super__Vector_base<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pAVar3 >> 3) *
              -0x5555555555555555;
      uVar7 = uVar6;
    } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
}

Assistant:

void Nova::Simplex_Mesh<d>::
Find_And_Append_Adjacent_Elements(const int simplex,const Vector<int,d-1>& face)
{
    int first_node=face(0);Vector<int,d-2> other_nodes=face.Remove_Index(0);
    for(size_t t=0;t<(*incident_elements)(first_node).size();++t){
        int simplex2=(*incident_elements)(first_node)(t);
        if(simplex2!=simplex && Nodes_In_Simplex(other_nodes,simplex2))
            (*adjacent_elements)(simplex).Append_Unique(simplex2);}
}